

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O1

void __thiscall maxNodeHeap::siftDown(maxNodeHeap *this,int pos)

{
  int iVar1;
  pointer ppVar2;
  pointer pQVar3;
  int __tmp;
  int iVar4;
  int iVar5;
  pointer ppVar6;
  int iVar7;
  
  do {
    ppVar2 = (this->m_heap).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = ppVar2[pos].first;
    iVar4 = pos * 2 + 1;
    iVar5 = pos * 2 + 2;
    iVar7 = (int)((ulong)((long)(this->m_heap).
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) >> 3);
    if (iVar5 < iVar7) {
      if ((ppVar2[iVar4].first < iVar1) && (ppVar2[iVar5].first < iVar1)) {
        return;
      }
      if (ppVar2[iVar4].first <= ppVar2[iVar5].first) {
        iVar4 = iVar5;
      }
      ppVar6 = ppVar2 + iVar4;
      iVar5 = ppVar6->first;
    }
    else {
      if (iVar7 <= iVar4) {
        return;
      }
      iVar5 = ppVar2[iVar4].first;
      if (iVar5 <= iVar1) {
        return;
      }
      ppVar6 = ppVar2 + iVar4;
    }
    ppVar2[pos].first = iVar5;
    ppVar6->first = iVar1;
    iVar1 = ppVar2[pos].second;
    ppVar2[pos].second = ppVar6->second;
    ppVar6->second = iVar1;
    pQVar3 = (this->m_elements).
             super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pQVar3[ppVar2[pos].second].m_index = pos;
    pQVar3[iVar1].m_index = iVar4;
    pos = iVar4;
  } while( true );
}

Assistant:

inline void maxNodeHeap::siftDown( int pos ) {

        int curKey   = m_heap[pos].first;
        int lhsChild = 2*pos+1;
        int rhsChild = 2*pos+2;
        if( rhsChild < (int) m_heap.size() ) {

                int lhsKey = m_heap[lhsChild].first;
                int rhsKey = m_heap[rhsChild].first;

                if( lhsKey < curKey && rhsKey < curKey) {
                        return; // we are done
                } else {
                        //exchange with the larger one (maxHeap)
                        int swap_pos = lhsKey > rhsKey ? lhsChild : rhsChild;
                        std::swap( m_heap[pos], m_heap[swap_pos]);

                        int element_pos = m_heap[pos].second;
                        m_elements[element_pos].set_index(pos);

                        element_pos = m_heap[swap_pos].second;
                        m_elements[element_pos].set_index(swap_pos);

                        siftDown(swap_pos);
                        return;
                }

        } else if ( lhsChild < (int)m_heap.size()) {
                if( m_heap[pos].first < m_heap[lhsChild].first) {
                        std::swap( m_heap[pos], m_heap[lhsChild]);

                        int element_pos = m_heap[pos].second;
                        m_elements[element_pos].set_index(pos);

                        element_pos = m_heap[lhsChild].second;
                        m_elements[element_pos].set_index(lhsChild);

                        siftDown(lhsChild);
                        return;
                } else {
                        return; // we are done
                }
        }
}